

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O3

void __thiscall Dependency::Dependency(Dependency *this,string *path,string *dependent_file)

{
  string *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string framework_root;
  string framework_path;
  string original_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string framework_name;
  string warning_msg;
  char buffer [4096];
  string local_1148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1128;
  string *local_1120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  undefined1 local_10d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1070;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1050;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1048;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1040;
  char local_1038 [4104];
  
  this->is_framework = false;
  this_00 = &this->filename;
  local_1040 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)local_1040;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  local_1128 = &this->prefix;
  local_1048 = &(this->prefix).field_2;
  (this->prefix)._M_dataplus._M_p = (pointer)local_1048;
  (this->prefix)._M_string_length = 0;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1078 = &this->new_name;
  local_1050 = &(this->new_name).field_2;
  (this->new_name)._M_dataplus._M_p = (pointer)local_1050;
  (this->new_name)._M_string_length = 0;
  (this->new_name).field_2._M_local_buf[0] = '\0';
  local_1120 = dependent_file;
  rtrim_in_place(path);
  local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
  local_10f8._M_string_length = 0;
  local_10f8.field_2._M_local_buf[0] = '\0';
  local_1070._M_dataplus._M_p = (pointer)&local_1070.field_2;
  local_1070._M_string_length = 0;
  local_1070.field_2._M_local_buf[0] = '\0';
  bVar1 = isRpath(path);
  if (bVar1) {
    searchFilenameInRpaths(&local_1148,path,local_1120);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_10f8,&local_1148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
      operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar3 = realpath((path->_M_dataplus)._M_p,local_1038);
    sVar6 = local_10f8._M_string_length;
    if (pcVar3 == (char *)0x0) {
      std::operator+(&local_1118,"\n/!\\ WARNING: Cannot resolve path \'",path);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1118,"\'\n");
      local_1148._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar9 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1148._M_dataplus._M_p == paVar9) {
        local_1148.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_1148.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_1148._M_dataplus._M_p = (pointer)&local_1148.field_2;
      }
      else {
        local_1148.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_1148._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_1070,&local_1148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
        operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
        operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_10f8,path);
    }
    else {
      sVar4 = strlen(local_1038);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_10f8,0,sVar6,local_1038,sVar4);
    }
  }
  bVar1 = Settings::verboseOutput();
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"** Dependency ctor **",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    sVar4 = path->_M_string_length;
    if ((sVar4 != local_1120->_M_string_length) ||
       ((sVar4 != 0 &&
        (iVar2 = bcmp((path->_M_dataplus)._M_p,(local_1120->_M_dataplus)._M_p,sVar4), iVar2 != 0))))
    {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  dependent file:  ",0x13);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(local_1120->_M_dataplus)._M_p,
                          local_1120->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  dependency path: ",0x13);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  original_file:   ",0x13);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_10f8._M_dataplus._M_p,
                        local_10f8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if ((local_10f8._M_string_length != path->_M_string_length) ||
     ((local_10f8._M_string_length != 0 &&
      (iVar2 = bcmp(local_10f8._M_dataplus._M_p,(path->_M_dataplus)._M_p,local_10f8._M_string_length
                   ), iVar2 != 0)))) {
    AddSymlink(this,path);
  }
  filePrefix(&local_1148,&local_10f8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_1128,&local_1148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
    operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
  }
  stripPrefix(&local_1148,&local_10f8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,&local_1148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
    operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
  }
  sVar6 = (this->prefix)._M_string_length;
  if ((sVar6 != 0) && ((local_1128->_M_dataplus)._M_p[sVar6 - 1] != '/')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (local_1128,"/");
  }
  bVar1 = Settings::isPrefixBundled(local_1128);
  if (!bVar1) goto LAB_00106b68;
  sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_10f8,".framework",0,10);
  if (sVar6 != 0xffffffffffffffff) {
    this->is_framework = true;
    getFrameworkRoot(&local_1148,&local_10f8);
    getFrameworkPath(&local_1118,&local_10f8);
    stripPrefix((string *)&local_10b8,&local_1148);
    filePrefix(&local_1098,&local_1148);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_1128,&local_1098);
    paVar9 = &local_1098.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1098._M_dataplus._M_p != paVar9) {
      operator_delete(local_1098._M_dataplus._M_p,local_1098.field_2._M_allocated_capacity + 1);
    }
    local_10d8._0_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_10d8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_10d8,local_10b8._M_allocated_capacity,
               (pointer)(local_10b8._8_8_ + local_10b8._M_allocated_capacity));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10d8,"/");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_10d8,local_1118._M_dataplus._M_p,local_1118._M_string_length);
    local_1098._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar10 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1098._M_dataplus._M_p == paVar10) {
      local_1098.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_1098.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_1098._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_1098.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_1098._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_1098);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1098._M_dataplus._M_p != paVar9) {
      operator_delete(local_1098._M_dataplus._M_p,local_1098.field_2._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10d8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_10d8 + 0x10)) {
      operator_delete((void *)local_10d8._0_8_,(ulong)(local_10d8._16_8_ + 1));
    }
    bVar1 = Settings::verboseOutput();
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  framework root: ",0x12);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_1148._M_dataplus._M_p,
                          local_1148._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  framework path: ",0x12);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_1118._M_dataplus._M_p,
                          local_1118._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  framework name: ",0x12);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_10b8._M_allocated_capacity,
                          local_10b8._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10b8._M_allocated_capacity != &local_10a8) {
      operator_delete((void *)local_10b8._M_allocated_capacity,local_10a8._M_allocated_capacity + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
      operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
      operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->prefix)._M_string_length == 0) {
LAB_00106750:
    Settings::searchPaths_abi_cxx11_();
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10d8._0_8_;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10d8._8_8_;
    if (local_10d8._0_8_ == local_10d8._8_8_) {
      initSearchPaths();
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10d8._0_8_
      ;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10d8._8_8_
      ;
    }
    for (; pbVar8 != pbVar7; pbVar8 = pbVar8 + 1) {
      std::operator+(&local_1148,pbVar8,this_00);
      bVar1 = fileExists(&local_1148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
        operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) {
        std::operator+(&local_1098,"FOUND ",this_00);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_1098," in ");
        local_10b8._M_allocated_capacity = (size_type)(pbVar7->_M_dataplus)._M_p;
        paVar9 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_10b8._M_allocated_capacity == paVar9) {
          local_10a8._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_10a8._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_10b8._M_allocated_capacity = (size_type)&local_10a8;
        }
        else {
          local_10a8._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_10b8._8_8_ = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_10b8,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
        local_1118._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar9 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1118._M_dataplus._M_p == paVar9) {
          local_1118.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_1118.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_1118._M_dataplus._M_p = (pointer)&local_1118.field_2;
        }
        else {
          local_1118.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_1118._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_1118,"\n");
        local_1148._M_dataplus._M_p = (pointer)&local_1148.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar10 = &pbVar7->field_2;
        if (paVar9 == paVar10) {
          local_1148.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_1148.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_1148.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_1148._M_dataplus._M_p = (pointer)paVar9;
        }
        local_1148._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_1070,local_1148._M_dataplus._M_p,local_1148._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
          operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
          operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_10b8._M_allocated_capacity != &local_10a8) {
          operator_delete((void *)local_10b8._M_allocated_capacity,
                          local_10a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
          operator_delete(local_1098._M_dataplus._M_p,local_1098.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (local_1128,pbVar8);
        Settings::missingPrefixes(true);
        break;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_10d8);
  }
  else {
    std::operator+(&local_1148,local_1128,this_00);
    bVar1 = fileExists(&local_1148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
      operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) goto LAB_00106750;
  }
  bVar1 = Settings::quietOutput();
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_1070._M_dataplus._M_p,local_1070._M_string_length);
  }
  bVar1 = Settings::isPrefixIgnored(local_1128);
  if (!bVar1) {
    if ((this->prefix)._M_string_length != 0) {
      std::operator+(&local_1148,local_1128,this_00);
      bVar1 = fileExists(&local_1148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
        operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) goto LAB_00106b58;
    }
    bVar1 = Settings::quietOutput();
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\n/!\\ WARNING: Dependency ",0x19);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->filename)._M_dataplus._M_p,
                          (this->filename)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," of ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(local_1120->_M_dataplus)._M_p,local_1120->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," not found\n",0xb);
    }
    bVar1 = Settings::verboseOutput();
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     path: ",0xb);
      std::operator+(&local_1148,local_1128,this_00);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_1148._M_dataplus._M_p,
                          local_1148._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
        operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
      }
    }
    Settings::missingPrefixes(true);
    getUserInputDirForFile(&local_1148,this_00,local_1120);
    Settings::addSearchPath(&local_1148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
      operator_delete(local_1148._M_dataplus._M_p,local_1148.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00106b58:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (local_1078,this_00);
LAB_00106b68:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1070._M_dataplus._M_p != &local_1070.field_2) {
    operator_delete(local_1070._M_dataplus._M_p,
                    CONCAT71(local_1070.field_2._M_allocated_capacity._1_7_,
                             local_1070.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
    operator_delete(local_10f8._M_dataplus._M_p,
                    CONCAT71(local_10f8.field_2._M_allocated_capacity._1_7_,
                             local_10f8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

Dependency::Dependency(string path, const string& dependent_file)
    : is_framework(false)
{
    char buffer[PATH_MAX];
    rtrim_in_place(path);
    string original_file;
    string warning_msg;

    if (isRpath(path))
    {
        original_file = searchFilenameInRpaths(path, dependent_file);
    }
    else if (realpath(path.c_str(), buffer))
    {
        original_file = buffer;
    }
    else
    {
        warning_msg = "\n/!\\ WARNING: Cannot resolve path '" + path + "'\n";
        original_file = path;
    }

    if (Settings::verboseOutput())
    {
        cout << "** Dependency ctor **" << endl;
        if (path != dependent_file)
            cout << "  dependent file:  " << dependent_file << endl;
        cout << "  dependency path: " << path << endl;
        cout << "  original_file:   " << original_file << endl;
    }

    // check if given path is a symlink
    if (original_file != path)
        AddSymlink(path);

    prefix = filePrefix(original_file);
    filename = stripPrefix(original_file);

    if (!prefix.empty() && prefix[prefix.size()-1] != '/')
        prefix += "/";

    // check if this dependency is in /usr/lib, /System/Library, or in ignored list
    if (!Settings::isPrefixBundled(prefix))
        return;

    if (original_file.find(".framework") != string::npos)
    {
        is_framework = true;
        string framework_root = getFrameworkRoot(original_file);
        string framework_path = getFrameworkPath(original_file);
        string framework_name = stripPrefix(framework_root);
        prefix = filePrefix(framework_root);
        filename = framework_name + "/" + framework_path;
        if (Settings::verboseOutput())
        {
            cout << "  framework root: " << framework_root << endl;
            cout << "  framework path: " << framework_path << endl;
            cout << "  framework name: " << framework_name << endl;
        }
    }

    // check if the lib is in a known location
    if (prefix.empty() || !fileExists(prefix+filename))
    {
        vector<string> search_paths = Settings::searchPaths();
        if (search_paths.empty())
            initSearchPaths();
        // check if file is contained in one of the paths
        for (const auto& search_path : search_paths)
        {
            if (fileExists(search_path+filename))
            {
                warning_msg += "FOUND " + filename + " in " + search_path + "\n";
                prefix = search_path;
                Settings::missingPrefixes(true);
                break;
            }
        }
    }

    if (!Settings::quietOutput())
        cout << warning_msg;

    // if the location is still unknown, ask the user for search path
    if (!Settings::isPrefixIgnored(prefix) && (prefix.empty() || !fileExists(prefix+filename)))
    {
        if (!Settings::quietOutput())
            cerr << "\n/!\\ WARNING: Dependency " << filename << " of " << dependent_file << " not found\n";
        if (Settings::verboseOutput())
            cout << "     path: " << (prefix+filename) << endl;
        Settings::missingPrefixes(true);
        Settings::addSearchPath(getUserInputDirForFile(filename, dependent_file));
    }
    new_name = filename;
}